

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

bool __thiscall Person::operator==(Person *this,Person *other)

{
  __type _Var1;
  bool local_19;
  Person *other_local;
  Person *this_local;
  
  _Var1 = std::operator==(&this->name,&other->name);
  local_19 = false;
  if (_Var1) {
    local_19 = this->age == other->age;
  }
  return local_19;
}

Assistant:

bool operator==(const Person & other) const
    {
        return (name == other.name) && (age == other.age);
    }